

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_sse2.c
# Opt level: O3

void aom_dc_predictor_16x4_sse2(uint8_t *dst,ptrdiff_t stride,uint8_t *above,uint8_t *left)

{
  ulong uVar1;
  undefined1 auVar2 [15];
  undefined1 auVar3 [15];
  undefined1 auVar4 [15];
  undefined1 auVar5 [15];
  undefined1 auVar6 [15];
  undefined1 auVar7 [15];
  undefined1 auVar8 [15];
  undefined1 auVar9 [15];
  undefined1 auVar10 [15];
  int iVar11;
  uint8_t *puVar12;
  undefined1 uVar13;
  undefined4 uVar14;
  undefined1 uVar16;
  undefined1 auVar15 [16];
  undefined1 auVar17 [16];
  
  uVar1 = *(ulong *)left;
  auVar2._8_6_ = 0;
  auVar2._0_8_ = uVar1;
  auVar2[0xe] = (char)(uVar1 >> 0x38);
  auVar3._8_4_ = 0;
  auVar3._0_8_ = uVar1;
  auVar3[0xc] = (char)(uVar1 >> 0x30);
  auVar3._13_2_ = auVar2._13_2_;
  auVar4._8_4_ = 0;
  auVar4._0_8_ = uVar1;
  auVar4._12_3_ = auVar3._12_3_;
  auVar5._8_2_ = 0;
  auVar5._0_8_ = uVar1;
  auVar5[10] = (char)(uVar1 >> 0x28);
  auVar5._11_4_ = auVar4._11_4_;
  auVar6._8_2_ = 0;
  auVar6._0_8_ = uVar1;
  auVar6._10_5_ = auVar5._10_5_;
  auVar7[8] = (char)(uVar1 >> 0x20);
  auVar7._0_8_ = uVar1;
  auVar7._9_6_ = auVar6._9_6_;
  auVar8._7_8_ = 0;
  auVar8._0_7_ = auVar7._8_7_;
  auVar9._1_8_ = SUB158(auVar8 << 0x40,7);
  auVar9[0] = (char)(uVar1 >> 0x18);
  auVar9._9_6_ = 0;
  auVar10._1_10_ = SUB1510(auVar9 << 0x30,5);
  auVar10[0] = (char)(uVar1 >> 0x10);
  auVar10._11_4_ = 0;
  auVar15._3_12_ = SUB1512(auVar10 << 0x20,3);
  auVar15[2] = (char)(uVar1 >> 8);
  auVar15[0] = (byte)uVar1;
  auVar15[1] = 0;
  auVar15[0xf] = 0;
  auVar15 = psadbw(auVar15,(undefined1  [16])0x0);
  auVar17 = psadbw((undefined1  [16])0x0,*(undefined1 (*) [16])above);
  iVar11 = (CONCAT22(auVar17._2_2_ + auVar15._2_2_ + auVar17._10_2_,
                     auVar17._0_2_ + auVar15._0_2_ + auVar17._8_2_) + 10U >> 2) * 0x3334;
  uVar16 = (undefined1)((uint)iVar11 >> 0x18);
  uVar13 = (undefined1)((uint)iVar11 >> 0x10);
  auVar15 = ZEXT416(CONCAT22(CONCAT11(uVar16,uVar16),CONCAT11(uVar13,uVar13)));
  auVar15 = pshuflw(auVar15,auVar15,0);
  uVar14 = auVar15._0_4_;
  *(undefined4 *)dst = uVar14;
  *(undefined4 *)(dst + 4) = uVar14;
  *(undefined4 *)(dst + 8) = uVar14;
  *(undefined4 *)(dst + 0xc) = uVar14;
  puVar12 = dst + stride;
  *(undefined4 *)puVar12 = uVar14;
  *(undefined4 *)(puVar12 + 4) = uVar14;
  *(undefined4 *)(puVar12 + 8) = uVar14;
  *(undefined4 *)(puVar12 + 0xc) = uVar14;
  puVar12 = dst + stride * 2;
  *(undefined4 *)puVar12 = uVar14;
  *(undefined4 *)(puVar12 + 4) = uVar14;
  *(undefined4 *)(puVar12 + 8) = uVar14;
  *(undefined4 *)(puVar12 + 0xc) = uVar14;
  puVar12 = dst + stride * 3;
  *(undefined4 *)puVar12 = uVar14;
  *(undefined4 *)(puVar12 + 4) = uVar14;
  *(undefined4 *)(puVar12 + 8) = uVar14;
  *(undefined4 *)(puVar12 + 0xc) = uVar14;
  return;
}

Assistant:

void aom_dc_predictor_16x4_sse2(uint8_t *dst, ptrdiff_t stride,
                                const uint8_t *above, const uint8_t *left) {
  const __m128i sum_left = dc_sum_4(left);
  __m128i sum_above = dc_sum_16_sse2(above);
  sum_above = _mm_add_epi16(sum_above, sum_left);

  uint32_t sum = (uint32_t)_mm_cvtsi128_si32(sum_above);
  sum += 10;
  sum = divide_using_multiply_shift(sum, 2, DC_MULTIPLIER_1X4);
  const __m128i row = _mm_set1_epi8((int8_t)sum);
  dc_store_16xh(&row, 4, dst, stride);
}